

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_input_pack8_avx
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  long lVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  undefined1 (*pauVar48) [32];
  undefined1 (*pauVar49) [32];
  undefined1 (*pauVar50) [32];
  undefined1 (*pauVar51) [32];
  long lVar52;
  long lVar53;
  long *in_RSI;
  long *in_RDI;
  __m256 _r0tm5;
  __m256 _r0tm4;
  __m256 _r0tm3;
  __m256 _r0tm2;
  __m256 _r0tm1;
  __m256 _r0tm0;
  __m256 _tmp05;
  __m256 _tmp04;
  __m256 _tmp03;
  __m256 _tmp02;
  __m256 _tmp01;
  __m256 _tmp00;
  int m_3;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m256 _tmp5m;
  __m256 _tmp4m;
  __m256 _tmp3m;
  __m256 _tmp2m;
  __m256 _tmp1m;
  __m256 _tmp0m;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [6] [6] [8];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_2294;
  undefined1 (*local_2290) [32];
  undefined8 *local_2288;
  undefined8 *local_2280;
  undefined8 *local_2278;
  undefined8 *local_2270;
  undefined8 *local_2268;
  int local_20d4;
  undefined8 *local_20d0;
  int local_20c8;
  int local_20c4;
  undefined8 local_20c0 [120];
  undefined1 auStack_1d00 [372];
  int local_1b8c;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  float local_16c0;
  float fStack_16bc;
  float fStack_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float fStack_16a8;
  float fStack_16a4;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  float fStack_1064;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  lVar44 = in_RDI[7];
  iVar45 = (iVar1 + -2) / 4;
  iVar46 = ((int)in_RDI[6] + -2) / 4;
  iVar47 = iVar45 * iVar46;
  for (local_1b8c = 0; local_1b8c < (int)lVar44; local_1b8c = local_1b8c + 1) {
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    lVar6 = in_RDI[2];
    lVar7 = *in_RSI;
    lVar8 = in_RSI[8];
    lVar9 = in_RSI[2];
    for (local_20c4 = 0; local_20c4 < iVar46; local_20c4 = local_20c4 + 1) {
      for (local_20c8 = 0; local_20c8 < iVar45; local_20c8 = local_20c8 + 1) {
        local_20d0 = (undefined8 *)
                     (lVar3 + lVar4 * local_1b8c * lVar5 +
                      (long)iVar2 * (long)(local_20c4 << 2) * lVar6 + (long)(local_20c8 << 5) * 4);
        for (local_20d4 = 0; local_20d4 < 6; local_20d4 = local_20d4 + 1) {
          pauVar48 = (undefined1 (*) [32])(local_20d0 + 4);
          pauVar49 = (undefined1 (*) [32])(local_20d0 + 8);
          pauVar50 = (undefined1 (*) [32])(local_20d0 + 0xc);
          pauVar51 = (undefined1 (*) [32])(local_20d0 + 0x10);
          auVar10 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x30);
          local_12a0 = auVar13._0_4_;
          fStack_129c = auVar13._4_4_;
          fStack_1298 = auVar13._8_4_;
          fStack_1294 = auVar13._12_4_;
          fStack_1290 = auVar12._0_4_;
          fStack_128c = auVar12._4_4_;
          fStack_1288 = auVar12._8_4_;
          fStack_1284 = auVar12._12_4_;
          local_d80 = (float)*local_20d0;
          fStack_d7c = (float)((ulong)*local_20d0 >> 0x20);
          fStack_d78 = (float)local_20d0[1];
          fStack_d74 = (float)((ulong)local_20d0[1] >> 0x20);
          fStack_d70 = (float)local_20d0[2];
          fStack_d6c = (float)((ulong)local_20d0[2] >> 0x20);
          fStack_d68 = (float)local_20d0[3];
          local_1280 = (float)*(undefined8 *)*pauVar51;
          fStack_127c = (float)((ulong)*(undefined8 *)*pauVar51 >> 0x20);
          fStack_1278 = (float)local_20d0[0x11];
          fStack_1274 = (float)((ulong)local_20d0[0x11] >> 0x20);
          fStack_1270 = (float)local_20d0[0x12];
          fStack_126c = (float)((ulong)local_20d0[0x12] >> 0x20);
          fStack_1268 = (float)local_20d0[0x13];
          fStack_1264 = (float)((ulong)local_20d0[0x13] >> 0x20);
          local_1300 = auVar11._0_4_;
          fStack_12fc = auVar11._4_4_;
          fStack_12f8 = auVar11._8_4_;
          fStack_12f4 = auVar11._12_4_;
          fStack_12f0 = auVar10._0_4_;
          fStack_12ec = auVar10._4_4_;
          fStack_12e8 = auVar10._8_4_;
          fStack_12e4 = auVar10._12_4_;
          local_d40 = (float)*(undefined8 *)*pauVar49;
          fStack_d3c = (float)((ulong)*(undefined8 *)*pauVar49 >> 0x20);
          fStack_d38 = (float)local_20d0[9];
          fStack_d34 = (float)((ulong)local_20d0[9] >> 0x20);
          fStack_d30 = (float)local_20d0[10];
          fStack_d2c = (float)((ulong)local_20d0[10] >> 0x20);
          fStack_d28 = (float)local_20d0[0xb];
          auVar10 = vinsertps_avx(ZEXT416(0xc0800000),ZEXT416(0xc0800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0800000),ZEXT416(0xc0800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0800000),0x30);
          local_da0 = (float)*(undefined8 *)*pauVar48;
          fStack_d9c = (float)((ulong)*(undefined8 *)*pauVar48 >> 0x20);
          fStack_d98 = (float)local_20d0[5];
          fStack_d94 = (float)((ulong)local_20d0[5] >> 0x20);
          fStack_d90 = (float)local_20d0[6];
          fStack_d8c = (float)((ulong)local_20d0[6] >> 0x20);
          fStack_d88 = (float)local_20d0[7];
          local_e00 = (float)*(undefined8 *)*pauVar50;
          fStack_dfc = (float)((ulong)*(undefined8 *)*pauVar50 >> 0x20);
          fStack_df8 = (float)local_20d0[0xd];
          fStack_df4 = (float)((ulong)local_20d0[0xd] >> 0x20);
          fStack_df0 = (float)local_20d0[0xe];
          fStack_dec = (float)((ulong)local_20d0[0xe] >> 0x20);
          fStack_de8 = (float)local_20d0[0xf];
          fStack_de4 = (float)((ulong)local_20d0[0xf] >> 0x20);
          local_1360 = auVar11._0_4_;
          fStack_135c = auVar11._4_4_;
          fStack_1358 = auVar11._8_4_;
          fStack_1354 = auVar11._12_4_;
          fStack_1350 = auVar10._0_4_;
          fStack_134c = auVar10._4_4_;
          fStack_1348 = auVar10._8_4_;
          fStack_1344 = auVar10._12_4_;
          auVar10 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x30);
          auVar14 = vsubps_avx(*pauVar48,*pauVar49);
          auVar15 = vsubps_avx(*pauVar51,*pauVar50);
          local_13c0 = auVar11._0_4_;
          fStack_13bc = auVar11._4_4_;
          fStack_13b8 = auVar11._8_4_;
          fStack_13b4 = auVar11._12_4_;
          fStack_13b0 = auVar10._0_4_;
          fStack_13ac = auVar10._4_4_;
          fStack_13a8 = auVar10._8_4_;
          fStack_13a4 = auVar10._12_4_;
          local_cc0 = auVar14._0_4_;
          fStack_cbc = auVar14._4_4_;
          fStack_cb8 = auVar14._8_4_;
          fStack_cb4 = auVar14._12_4_;
          fStack_cb0 = auVar14._16_4_;
          fStack_cac = auVar14._20_4_;
          fStack_ca8 = auVar14._24_4_;
          local_11c0 = auVar15._0_4_;
          fStack_11bc = auVar15._4_4_;
          fStack_11b8 = auVar15._8_4_;
          fStack_11b4 = auVar15._12_4_;
          fStack_11b0 = auVar15._16_4_;
          fStack_11ac = auVar15._20_4_;
          fStack_11a8 = auVar15._24_4_;
          fStack_11a4 = auVar15._28_4_;
          auVar10 = vinsertps_avx(ZEXT416(0xc0000000),ZEXT416(0xc0000000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0000000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0000000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0000000),ZEXT416(0xc0000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0000000),0x30);
          auVar14 = vsubps_avx(*pauVar48,*pauVar50);
          auVar15 = vsubps_avx(*pauVar51,*pauVar49);
          local_1420 = auVar11._0_4_;
          fStack_141c = auVar11._4_4_;
          fStack_1418 = auVar11._8_4_;
          fStack_1414 = auVar11._12_4_;
          fStack_1410 = auVar10._0_4_;
          fStack_140c = auVar10._4_4_;
          fStack_1408 = auVar10._8_4_;
          fStack_1404 = auVar10._12_4_;
          local_c80 = auVar14._0_4_;
          fStack_c7c = auVar14._4_4_;
          fStack_c78 = auVar14._8_4_;
          fStack_c74 = auVar14._12_4_;
          fStack_c70 = auVar14._16_4_;
          fStack_c6c = auVar14._20_4_;
          fStack_c68 = auVar14._24_4_;
          local_1180 = auVar15._0_4_;
          fStack_117c = auVar15._4_4_;
          fStack_1178 = auVar15._8_4_;
          fStack_1174 = auVar15._12_4_;
          fStack_1170 = auVar15._16_4_;
          fStack_116c = auVar15._20_4_;
          fStack_1168 = auVar15._24_4_;
          fStack_1164 = auVar15._28_4_;
          auVar10 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40000000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40000000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar14 = vsubps_avx(*pauVar48,*pauVar50);
          auVar15 = vsubps_avx(*pauVar51,*pauVar49);
          local_1480 = auVar11._0_4_;
          fStack_147c = auVar11._4_4_;
          fStack_1478 = auVar11._8_4_;
          fStack_1474 = auVar11._12_4_;
          fStack_1470 = auVar10._0_4_;
          fStack_146c = auVar10._4_4_;
          fStack_1468 = auVar10._8_4_;
          fStack_1464 = auVar10._12_4_;
          local_c40 = auVar14._0_4_;
          fStack_c3c = auVar14._4_4_;
          fStack_c38 = auVar14._8_4_;
          fStack_c34 = auVar14._12_4_;
          fStack_c30 = auVar14._16_4_;
          fStack_c2c = auVar14._20_4_;
          fStack_c28 = auVar14._24_4_;
          local_1140 = auVar15._0_4_;
          fStack_113c = auVar15._4_4_;
          fStack_1138 = auVar15._8_4_;
          fStack_1134 = auVar15._12_4_;
          fStack_1130 = auVar15._16_4_;
          fStack_112c = auVar15._20_4_;
          fStack_1128 = auVar15._24_4_;
          fStack_1124 = auVar15._28_4_;
          auVar10 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x30);
          local_14e0 = auVar13._0_4_;
          fStack_14dc = auVar13._4_4_;
          fStack_14d8 = auVar13._8_4_;
          fStack_14d4 = auVar13._12_4_;
          fStack_14d0 = auVar12._0_4_;
          fStack_14cc = auVar12._4_4_;
          fStack_14c8 = auVar12._8_4_;
          fStack_14c4 = auVar12._12_4_;
          local_1100 = (float)local_20d0[0x14];
          fStack_10fc = (float)((ulong)local_20d0[0x14] >> 0x20);
          fStack_10f8 = (float)local_20d0[0x15];
          fStack_10f4 = (float)((ulong)local_20d0[0x15] >> 0x20);
          fStack_10f0 = (float)local_20d0[0x16];
          fStack_10ec = (float)((ulong)local_20d0[0x16] >> 0x20);
          fStack_10e8 = (float)local_20d0[0x17];
          fStack_10e4 = (float)((ulong)local_20d0[0x17] >> 0x20);
          local_1540 = auVar11._0_4_;
          fStack_153c = auVar11._4_4_;
          fStack_1538 = auVar11._8_4_;
          fStack_1534 = auVar11._12_4_;
          fStack_1530 = auVar10._0_4_;
          fStack_152c = auVar10._4_4_;
          fStack_1528 = auVar10._8_4_;
          fStack_1524 = auVar10._12_4_;
          auVar14._4_4_ = fStack_153c * fStack_dfc + fStack_14dc * fStack_d9c + fStack_10fc;
          auVar14._0_4_ = local_1540 * local_e00 + local_14e0 * local_da0 + local_1100;
          auVar14._12_4_ = fStack_1534 * fStack_df4 + fStack_14d4 * fStack_d94 + fStack_10f4;
          auVar14._8_4_ = fStack_1538 * fStack_df8 + fStack_14d8 * fStack_d98 + fStack_10f8;
          auVar14._20_4_ = fStack_152c * fStack_dec + fStack_14cc * fStack_d8c + fStack_10ec;
          auVar14._16_4_ = fStack_1530 * fStack_df0 + fStack_14d0 * fStack_d90 + fStack_10f0;
          auVar14._28_4_ = fStack_1524 + fStack_14c4 + fStack_10e4;
          auVar14._24_4_ = fStack_1528 * fStack_de8 + fStack_14c8 * fStack_d88 + fStack_10e8;
          lVar53 = (long)local_20d4;
          local_20c0[lVar53 * 4] =
               CONCAT44(fStack_12fc * fStack_d3c + fStack_129c * fStack_d7c + fStack_127c,
                        local_1300 * local_d40 + local_12a0 * local_d80 + local_1280);
          local_20c0[lVar53 * 4 + 1] =
               CONCAT44(fStack_12f4 * fStack_d34 + fStack_1294 * fStack_d74 + fStack_1274,
                        fStack_12f8 * fStack_d38 + fStack_1298 * fStack_d78 + fStack_1278);
          local_20c0[lVar53 * 4 + 2] =
               CONCAT44(fStack_12ec * fStack_d2c + fStack_128c * fStack_d6c + fStack_126c,
                        fStack_12f0 * fStack_d30 + fStack_1290 * fStack_d70 + fStack_1270);
          local_20c0[lVar53 * 4 + 3] =
               CONCAT44(fStack_12e4 + fStack_1284 + fStack_1264,
                        fStack_12e8 * fStack_d28 + fStack_1288 * fStack_d68 + fStack_1268);
          lVar53 = (long)local_20d4;
          local_20c0[lVar53 * 4 + 0x18] =
               CONCAT44(fStack_135c * (fStack_d9c + fStack_d3c) + fStack_127c + fStack_dfc,
                        local_1360 * (local_da0 + local_d40) + local_1280 + local_e00);
          local_20c0[lVar53 * 4 + 0x19] =
               CONCAT44(fStack_1354 * (fStack_d94 + fStack_d34) + fStack_1274 + fStack_df4,
                        fStack_1358 * (fStack_d98 + fStack_d38) + fStack_1278 + fStack_df8);
          local_20c0[lVar53 * 4 + 0x1a] =
               CONCAT44(fStack_134c * (fStack_d8c + fStack_d2c) + fStack_126c + fStack_dec,
                        fStack_1350 * (fStack_d90 + fStack_d30) + fStack_1270 + fStack_df0);
          local_20c0[lVar53 * 4 + 0x1b] =
               CONCAT44(fStack_1344 + fStack_1264 + fStack_de4,
                        fStack_1348 * (fStack_d88 + fStack_d28) + fStack_1268 + fStack_de8);
          lVar53 = (long)local_20d4;
          local_20c0[lVar53 * 4 + 0x30] =
               CONCAT44(fStack_13bc * fStack_cbc + fStack_11bc,local_13c0 * local_cc0 + local_11c0);
          local_20c0[lVar53 * 4 + 0x31] =
               CONCAT44(fStack_13b4 * fStack_cb4 + fStack_11b4,
                        fStack_13b8 * fStack_cb8 + fStack_11b8);
          local_20c0[lVar53 * 4 + 0x32] =
               CONCAT44(fStack_13ac * fStack_cac + fStack_11ac,
                        fStack_13b0 * fStack_cb0 + fStack_11b0);
          local_20c0[lVar53 * 4 + 0x33] =
               CONCAT44(fStack_13a4 + fStack_11a4,fStack_13a8 * fStack_ca8 + fStack_11a8);
          lVar53 = (long)local_20d4 * 0x20;
          *(ulong *)(auStack_1d00 + lVar53 + -0x180) =
               CONCAT44(fStack_141c * fStack_c7c + fStack_117c,local_1420 * local_c80 + local_1180);
          *(ulong *)(auStack_1d00 + lVar53 + -0x178) =
               CONCAT44(fStack_1414 * fStack_c74 + fStack_1174,
                        fStack_1418 * fStack_c78 + fStack_1178);
          *(ulong *)(auStack_1d00 + lVar53 + -0x170) =
               CONCAT44(fStack_140c * fStack_c6c + fStack_116c,
                        fStack_1410 * fStack_c70 + fStack_1170);
          *(ulong *)(auStack_1d00 + lVar53 + -0x168) =
               CONCAT44(fStack_1404 + fStack_1164,fStack_1408 * fStack_c68 + fStack_1168);
          lVar53 = (long)local_20d4 * 0x20;
          *(ulong *)(auStack_1d00 + lVar53 + -0xc0) =
               CONCAT44(fStack_147c * fStack_c3c + fStack_113c,local_1480 * local_c40 + local_1140);
          *(ulong *)(auStack_1d00 + lVar53 + -0xb8) =
               CONCAT44(fStack_1474 * fStack_c34 + fStack_1134,
                        fStack_1478 * fStack_c38 + fStack_1138);
          *(ulong *)(auStack_1d00 + lVar53 + -0xb0) =
               CONCAT44(fStack_146c * fStack_c2c + fStack_112c,
                        fStack_1470 * fStack_c30 + fStack_1130);
          *(ulong *)(auStack_1d00 + lVar53 + -0xa8) =
               CONCAT44(fStack_1464 + fStack_1124,fStack_1468 * fStack_c28 + fStack_1128);
          *(undefined1 (*) [32])(auStack_1d00 + (long)local_20d4 * 0x20) = auVar14;
          local_20d0 = (undefined8 *)((long)local_20d0 + (long)(iVar1 << 3) * 4);
        }
        local_2268 = (undefined8 *)
                     (lVar7 + lVar8 * local_1b8c * lVar9 +
                     (long)((local_20c4 * iVar45 + local_20c8) * 8) * 4);
        local_2270 = (undefined8 *)((long)local_2268 + (long)(iVar47 * 8) * 4);
        local_2278 = (undefined8 *)((long)local_2268 + (long)(iVar47 * 0x10) * 4);
        local_2280 = (undefined8 *)((long)local_2268 + (long)(iVar47 * 0x18) * 4);
        local_2288 = (undefined8 *)((long)local_2268 + (long)(iVar47 * 0x20) * 4);
        local_2290 = (undefined1 (*) [32])((long)local_2268 + (long)(iVar47 * 0x28) * 4);
        for (local_2294 = 0; local_2294 < 6; local_2294 = local_2294 + 1) {
          lVar53 = (long)local_2294;
          lVar52 = (long)local_2294;
          uVar16 = local_20c0[lVar52 * 0x18 + 4];
          uVar17 = local_20c0[lVar52 * 0x18 + 5];
          uVar18 = local_20c0[lVar52 * 0x18 + 6];
          uVar19 = local_20c0[lVar52 * 0x18 + 7];
          lVar52 = (long)local_2294;
          uVar20 = local_20c0[lVar52 * 0x18 + 8];
          uVar21 = local_20c0[lVar52 * 0x18 + 9];
          uVar22 = local_20c0[lVar52 * 0x18 + 10];
          uVar23 = local_20c0[lVar52 * 0x18 + 0xb];
          lVar52 = (long)local_2294;
          uVar24 = local_20c0[lVar52 * 0x18 + 0xc];
          uVar25 = local_20c0[lVar52 * 0x18 + 0xd];
          uVar26 = local_20c0[lVar52 * 0x18 + 0xe];
          uVar27 = local_20c0[lVar52 * 0x18 + 0xf];
          lVar52 = (long)local_2294;
          uVar28 = local_20c0[lVar52 * 0x18 + 0x10];
          uVar29 = local_20c0[lVar52 * 0x18 + 0x11];
          uVar30 = local_20c0[lVar52 * 0x18 + 0x12];
          uVar31 = local_20c0[lVar52 * 0x18 + 0x13];
          lVar52 = (long)local_2294;
          auVar10 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x30);
          local_15a0 = auVar13._0_4_;
          fStack_159c = auVar13._4_4_;
          fStack_1598 = auVar13._8_4_;
          fStack_1594 = auVar13._12_4_;
          fStack_1590 = auVar12._0_4_;
          fStack_158c = auVar12._4_4_;
          fStack_1588 = auVar12._8_4_;
          fStack_1584 = auVar12._12_4_;
          local_b80 = (float)local_20c0[lVar53 * 0x18];
          fStack_b7c = (float)((ulong)local_20c0[lVar53 * 0x18] >> 0x20);
          fStack_b78 = (float)local_20c0[lVar53 * 0x18 + 1];
          fStack_b74 = (float)((ulong)local_20c0[lVar53 * 0x18 + 1] >> 0x20);
          fStack_b70 = (float)local_20c0[lVar53 * 0x18 + 2];
          fStack_b6c = (float)((ulong)local_20c0[lVar53 * 0x18 + 2] >> 0x20);
          fStack_b68 = (float)local_20c0[lVar53 * 0x18 + 3];
          local_1080 = (float)uVar28;
          fStack_107c = (float)((ulong)uVar28 >> 0x20);
          fStack_1078 = (float)uVar29;
          fStack_1074 = (float)((ulong)uVar29 >> 0x20);
          fStack_1070 = (float)uVar30;
          fStack_106c = (float)((ulong)uVar30 >> 0x20);
          fStack_1068 = (float)uVar31;
          fStack_1064 = (float)((ulong)uVar31 >> 0x20);
          local_1600 = auVar11._0_4_;
          fStack_15fc = auVar11._4_4_;
          fStack_15f8 = auVar11._8_4_;
          fStack_15f4 = auVar11._12_4_;
          fStack_15f0 = auVar10._0_4_;
          fStack_15ec = auVar10._4_4_;
          fStack_15e8 = auVar10._8_4_;
          fStack_15e4 = auVar10._12_4_;
          local_b40 = (float)uVar20;
          fStack_b3c = (float)((ulong)uVar20 >> 0x20);
          fStack_b38 = (float)uVar21;
          fStack_b34 = (float)((ulong)uVar21 >> 0x20);
          fStack_b30 = (float)uVar22;
          fStack_b2c = (float)((ulong)uVar22 >> 0x20);
          fStack_b28 = (float)uVar23;
          auVar10 = vinsertps_avx(ZEXT416(0xc0800000),ZEXT416(0xc0800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0800000),ZEXT416(0xc0800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0800000),0x30);
          local_e20 = (float)uVar16;
          fStack_e1c = (float)((ulong)uVar16 >> 0x20);
          fStack_e18 = (float)uVar17;
          fStack_e14 = (float)((ulong)uVar17 >> 0x20);
          fStack_e10 = (float)uVar18;
          fStack_e0c = (float)((ulong)uVar18 >> 0x20);
          fStack_e08 = (float)uVar19;
          local_e80 = (float)uVar24;
          fStack_e7c = (float)((ulong)uVar24 >> 0x20);
          fStack_e78 = (float)uVar25;
          fStack_e74 = (float)((ulong)uVar25 >> 0x20);
          fStack_e70 = (float)uVar26;
          fStack_e6c = (float)((ulong)uVar26 >> 0x20);
          fStack_e68 = (float)uVar27;
          fStack_e64 = (float)((ulong)uVar27 >> 0x20);
          local_1660 = auVar11._0_4_;
          fStack_165c = auVar11._4_4_;
          fStack_1658 = auVar11._8_4_;
          fStack_1654 = auVar11._12_4_;
          fStack_1650 = auVar10._0_4_;
          fStack_164c = auVar10._4_4_;
          fStack_1648 = auVar10._8_4_;
          fStack_1644 = auVar10._12_4_;
          auVar10 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x30);
          auVar43._8_8_ = uVar17;
          auVar43._0_8_ = uVar16;
          auVar43._16_8_ = uVar18;
          auVar43._24_8_ = uVar19;
          auVar42._8_8_ = uVar21;
          auVar42._0_8_ = uVar20;
          auVar42._16_8_ = uVar22;
          auVar42._24_8_ = uVar23;
          auVar14 = vsubps_avx(auVar43,auVar42);
          auVar41._8_8_ = uVar29;
          auVar41._0_8_ = uVar28;
          auVar41._16_8_ = uVar30;
          auVar41._24_8_ = uVar31;
          auVar40._8_8_ = uVar25;
          auVar40._0_8_ = uVar24;
          auVar40._16_8_ = uVar26;
          auVar40._24_8_ = uVar27;
          auVar15 = vsubps_avx(auVar41,auVar40);
          local_16c0 = auVar11._0_4_;
          fStack_16bc = auVar11._4_4_;
          fStack_16b8 = auVar11._8_4_;
          fStack_16b4 = auVar11._12_4_;
          fStack_16b0 = auVar10._0_4_;
          fStack_16ac = auVar10._4_4_;
          fStack_16a8 = auVar10._8_4_;
          fStack_16a4 = auVar10._12_4_;
          local_ac0 = auVar14._0_4_;
          fStack_abc = auVar14._4_4_;
          fStack_ab8 = auVar14._8_4_;
          fStack_ab4 = auVar14._12_4_;
          fStack_ab0 = auVar14._16_4_;
          fStack_aac = auVar14._20_4_;
          fStack_aa8 = auVar14._24_4_;
          local_fc0 = auVar15._0_4_;
          fStack_fbc = auVar15._4_4_;
          fStack_fb8 = auVar15._8_4_;
          fStack_fb4 = auVar15._12_4_;
          fStack_fb0 = auVar15._16_4_;
          fStack_fac = auVar15._20_4_;
          fStack_fa8 = auVar15._24_4_;
          fStack_fa4 = auVar15._28_4_;
          auVar10 = vinsertps_avx(ZEXT416(0xc0000000),ZEXT416(0xc0000000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0000000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0000000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0000000),ZEXT416(0xc0000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0000000),0x30);
          auVar39._8_8_ = uVar17;
          auVar39._0_8_ = uVar16;
          auVar39._16_8_ = uVar18;
          auVar39._24_8_ = uVar19;
          auVar38._8_8_ = uVar25;
          auVar38._0_8_ = uVar24;
          auVar38._16_8_ = uVar26;
          auVar38._24_8_ = uVar27;
          auVar14 = vsubps_avx(auVar39,auVar38);
          auVar37._8_8_ = uVar29;
          auVar37._0_8_ = uVar28;
          auVar37._16_8_ = uVar30;
          auVar37._24_8_ = uVar31;
          auVar36._8_8_ = uVar21;
          auVar36._0_8_ = uVar20;
          auVar36._16_8_ = uVar22;
          auVar36._24_8_ = uVar23;
          auVar15 = vsubps_avx(auVar37,auVar36);
          local_1720 = auVar11._0_4_;
          fStack_171c = auVar11._4_4_;
          fStack_1718 = auVar11._8_4_;
          fStack_1714 = auVar11._12_4_;
          fStack_1710 = auVar10._0_4_;
          fStack_170c = auVar10._4_4_;
          fStack_1708 = auVar10._8_4_;
          fStack_1704 = auVar10._12_4_;
          local_a80 = auVar14._0_4_;
          fStack_a7c = auVar14._4_4_;
          fStack_a78 = auVar14._8_4_;
          fStack_a74 = auVar14._12_4_;
          fStack_a70 = auVar14._16_4_;
          fStack_a6c = auVar14._20_4_;
          fStack_a68 = auVar14._24_4_;
          local_f80 = auVar15._0_4_;
          fStack_f7c = auVar15._4_4_;
          fStack_f78 = auVar15._8_4_;
          fStack_f74 = auVar15._12_4_;
          fStack_f70 = auVar15._16_4_;
          fStack_f6c = auVar15._20_4_;
          fStack_f68 = auVar15._24_4_;
          fStack_f64 = auVar15._28_4_;
          auVar10 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40000000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x40000000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar35._8_8_ = uVar17;
          auVar35._0_8_ = uVar16;
          auVar35._16_8_ = uVar18;
          auVar35._24_8_ = uVar19;
          auVar34._8_8_ = uVar25;
          auVar34._0_8_ = uVar24;
          auVar34._16_8_ = uVar26;
          auVar34._24_8_ = uVar27;
          auVar14 = vsubps_avx(auVar35,auVar34);
          auVar33._8_8_ = uVar29;
          auVar33._0_8_ = uVar28;
          auVar33._16_8_ = uVar30;
          auVar33._24_8_ = uVar31;
          auVar32._8_8_ = uVar21;
          auVar32._0_8_ = uVar20;
          auVar32._16_8_ = uVar22;
          auVar32._24_8_ = uVar23;
          auVar15 = vsubps_avx(auVar33,auVar32);
          local_1780 = auVar11._0_4_;
          fStack_177c = auVar11._4_4_;
          fStack_1778 = auVar11._8_4_;
          fStack_1774 = auVar11._12_4_;
          fStack_1770 = auVar10._0_4_;
          fStack_176c = auVar10._4_4_;
          fStack_1768 = auVar10._8_4_;
          fStack_1764 = auVar10._12_4_;
          local_a40 = auVar14._0_4_;
          fStack_a3c = auVar14._4_4_;
          fStack_a38 = auVar14._8_4_;
          fStack_a34 = auVar14._12_4_;
          fStack_a30 = auVar14._16_4_;
          fStack_a2c = auVar14._20_4_;
          fStack_a28 = auVar14._24_4_;
          local_f40 = auVar15._0_4_;
          fStack_f3c = auVar15._4_4_;
          fStack_f38 = auVar15._8_4_;
          fStack_f34 = auVar15._12_4_;
          fStack_f30 = auVar15._16_4_;
          fStack_f2c = auVar15._20_4_;
          fStack_f28 = auVar15._24_4_;
          fStack_f24 = auVar15._28_4_;
          auVar10 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0a00000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0xc0a00000),ZEXT416(0xc0a00000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0xc0a00000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x30);
          local_17e0 = auVar13._0_4_;
          fStack_17dc = auVar13._4_4_;
          fStack_17d8 = auVar13._8_4_;
          fStack_17d4 = auVar13._12_4_;
          fStack_17d0 = auVar12._0_4_;
          fStack_17cc = auVar12._4_4_;
          fStack_17c8 = auVar12._8_4_;
          fStack_17c4 = auVar12._12_4_;
          local_f00 = (float)local_20c0[lVar52 * 0x18 + 0x14];
          fStack_efc = (float)((ulong)local_20c0[lVar52 * 0x18 + 0x14] >> 0x20);
          fStack_ef8 = (float)local_20c0[lVar52 * 0x18 + 0x15];
          fStack_ef4 = (float)((ulong)local_20c0[lVar52 * 0x18 + 0x15] >> 0x20);
          fStack_ef0 = (float)local_20c0[lVar52 * 0x18 + 0x16];
          fStack_eec = (float)((ulong)local_20c0[lVar52 * 0x18 + 0x16] >> 0x20);
          fStack_ee8 = (float)local_20c0[lVar52 * 0x18 + 0x17];
          fStack_ee4 = (float)((ulong)local_20c0[lVar52 * 0x18 + 0x17] >> 0x20);
          local_1840 = auVar11._0_4_;
          fStack_183c = auVar11._4_4_;
          fStack_1838 = auVar11._8_4_;
          fStack_1834 = auVar11._12_4_;
          fStack_1830 = auVar10._0_4_;
          fStack_182c = auVar10._4_4_;
          fStack_1828 = auVar10._8_4_;
          fStack_1824 = auVar10._12_4_;
          auVar15._4_4_ = fStack_183c * fStack_e7c + fStack_17dc * fStack_e1c + fStack_efc;
          auVar15._0_4_ = local_1840 * local_e80 + local_17e0 * local_e20 + local_f00;
          auVar15._12_4_ = fStack_1834 * fStack_e74 + fStack_17d4 * fStack_e14 + fStack_ef4;
          auVar15._8_4_ = fStack_1838 * fStack_e78 + fStack_17d8 * fStack_e18 + fStack_ef8;
          auVar15._20_4_ = fStack_182c * fStack_e6c + fStack_17cc * fStack_e0c + fStack_eec;
          auVar15._16_4_ = fStack_1830 * fStack_e70 + fStack_17d0 * fStack_e10 + fStack_ef0;
          auVar15._28_4_ = fStack_1824 + fStack_17c4 + fStack_ee4;
          auVar15._24_4_ = fStack_1828 * fStack_e68 + fStack_17c8 * fStack_e08 + fStack_ee8;
          *local_2268 = CONCAT44(fStack_15fc * fStack_b3c + fStack_159c * fStack_b7c + fStack_107c,
                                 local_1600 * local_b40 + local_15a0 * local_b80 + local_1080);
          local_2268[1] =
               CONCAT44(fStack_15f4 * fStack_b34 + fStack_1594 * fStack_b74 + fStack_1074,
                        fStack_15f8 * fStack_b38 + fStack_1598 * fStack_b78 + fStack_1078);
          local_2268[2] =
               CONCAT44(fStack_15ec * fStack_b2c + fStack_158c * fStack_b6c + fStack_106c,
                        fStack_15f0 * fStack_b30 + fStack_1590 * fStack_b70 + fStack_1070);
          local_2268[3] =
               CONCAT44(fStack_15e4 + fStack_1584 + fStack_1064,
                        fStack_15e8 * fStack_b28 + fStack_1588 * fStack_b68 + fStack_1068);
          *local_2270 = CONCAT44(fStack_165c * (fStack_e1c + fStack_b3c) + fStack_107c + fStack_e7c,
                                 local_1660 * (local_e20 + local_b40) + local_1080 + local_e80);
          local_2270[1] =
               CONCAT44(fStack_1654 * (fStack_e14 + fStack_b34) + fStack_1074 + fStack_e74,
                        fStack_1658 * (fStack_e18 + fStack_b38) + fStack_1078 + fStack_e78);
          local_2270[2] =
               CONCAT44(fStack_164c * (fStack_e0c + fStack_b2c) + fStack_106c + fStack_e6c,
                        fStack_1650 * (fStack_e10 + fStack_b30) + fStack_1070 + fStack_e70);
          local_2270[3] =
               CONCAT44(fStack_1644 + fStack_1064 + fStack_e64,
                        fStack_1648 * (fStack_e08 + fStack_b28) + fStack_1068 + fStack_e68);
          *local_2278 = CONCAT44(fStack_16bc * fStack_abc + fStack_fbc,
                                 local_16c0 * local_ac0 + local_fc0);
          local_2278[1] =
               CONCAT44(fStack_16b4 * fStack_ab4 + fStack_fb4,fStack_16b8 * fStack_ab8 + fStack_fb8)
          ;
          local_2278[2] =
               CONCAT44(fStack_16ac * fStack_aac + fStack_fac,fStack_16b0 * fStack_ab0 + fStack_fb0)
          ;
          local_2278[3] = CONCAT44(fStack_16a4 + fStack_fa4,fStack_16a8 * fStack_aa8 + fStack_fa8);
          *local_2280 = CONCAT44(fStack_171c * fStack_a7c + fStack_f7c,
                                 local_1720 * local_a80 + local_f80);
          local_2280[1] =
               CONCAT44(fStack_1714 * fStack_a74 + fStack_f74,fStack_1718 * fStack_a78 + fStack_f78)
          ;
          local_2280[2] =
               CONCAT44(fStack_170c * fStack_a6c + fStack_f6c,fStack_1710 * fStack_a70 + fStack_f70)
          ;
          local_2280[3] = CONCAT44(fStack_1704 + fStack_f64,fStack_1708 * fStack_a68 + fStack_f68);
          *local_2288 = CONCAT44(fStack_177c * fStack_a3c + fStack_f3c,
                                 local_1780 * local_a40 + local_f40);
          local_2288[1] =
               CONCAT44(fStack_1774 * fStack_a34 + fStack_f34,fStack_1778 * fStack_a38 + fStack_f38)
          ;
          local_2288[2] =
               CONCAT44(fStack_176c * fStack_a2c + fStack_f2c,fStack_1770 * fStack_a30 + fStack_f30)
          ;
          local_2288[3] = CONCAT44(fStack_1764 + fStack_f24,fStack_1768 * fStack_a28 + fStack_f28);
          *local_2290 = auVar15;
          local_2268 = (undefined8 *)((long)local_2268 + (long)(iVar47 * 0x30) * 4);
          local_2270 = (undefined8 *)((long)local_2270 + (long)(iVar47 * 0x30) * 4);
          local_2278 = (undefined8 *)((long)local_2278 + (long)(iVar47 * 0x30) * 4);
          local_2280 = (undefined8 *)((long)local_2280 + (long)(iVar47 * 0x30) * 4);
          local_2288 = (undefined8 *)((long)local_2288 + (long)(iVar47 * 0x30) * 4);
          local_2290 = (undefined1 (*) [32])(*local_2290 + (long)(iVar47 * 0x30) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_input_pack8_avx(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 4;
    const int h_tiles = (h - 2) / 4;
    const int tiles = w_tiles * h_tiles;

    // const float itm[4][4] = {
    //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
    //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
    //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
    //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
    // };

    // 0 =  4 * r00 - 5 * r02 + r04
    // 1 = -4 * (r01 + r02) + r04 + r03
    // 2 =  4 * (r01 - r02) + r04 - r03
    // 3 = -2 * (r01 - r03) + r04 - r02
    // 4 =  2 * (r01 - r03) + r04 - r02
    // 5 =  4 * r01 - 5 * r03 + r05

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[6][6][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 4) + (j * 4) * 8;

                for (int m = 0; m < 6; m++)
                {
                    __m256 _r00 = _mm256_load_ps(r0);
                    __m256 _r01 = _mm256_load_ps(r0 + 8);
                    __m256 _r02 = _mm256_load_ps(r0 + 8 * 2);
                    __m256 _r03 = _mm256_load_ps(r0 + 8 * 3);
                    __m256 _r04 = _mm256_load_ps(r0 + 8 * 4);
                    __m256 _r05 = _mm256_load_ps(r0 + 8 * 5);

                    __m256 _tmp0m = _mm256_comp_fmadd_ps(_mm256_set1_ps(-5.f), _r02, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _r00, _r04));
                    __m256 _tmp1m = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.f), _mm256_add_ps(_r01, _r02), _mm256_add_ps(_r04, _r03));
                    __m256 _tmp2m = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_sub_ps(_r01, _r02), _mm256_sub_ps(_r04, _r03));
                    __m256 _tmp3m = _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.f), _mm256_sub_ps(_r01, _r03), _mm256_sub_ps(_r04, _r02));
                    __m256 _tmp4m = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _mm256_sub_ps(_r01, _r03), _mm256_sub_ps(_r04, _r02));
                    __m256 _tmp5m = _mm256_comp_fmadd_ps(_mm256_set1_ps(-5.f), _r03, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _r01, _r05));

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
                    _mm256_storeu_ps(tmp[4][m], _tmp4m);
                    _mm256_storeu_ps(tmp[5][m], _tmp5m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
                    _mm256_store_ps(tmp[4][m], _tmp4m);
                    _mm256_store_ps(tmp[5][m], _tmp5m);
#endif

                    r0 += w * 8;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 8;
                float* r0_tm_1 = r0_tm_0 + tiles * 8;
                float* r0_tm_2 = r0_tm_0 + tiles * 8 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 8 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 8 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 8 * 5;

                for (int m = 0; m < 6; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_loadu_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_loadu_ps(tmp[m][5]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_load_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_load_ps(tmp[m][5]);
#endif

                    __m256 _r0tm0 = _mm256_comp_fmadd_ps(_mm256_set1_ps(-5.f), _tmp02, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp00, _tmp04));
                    __m256 _r0tm1 = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.f), _mm256_add_ps(_tmp01, _tmp02), _mm256_add_ps(_tmp04, _tmp03));
                    __m256 _r0tm2 = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_sub_ps(_tmp01, _tmp02), _mm256_sub_ps(_tmp04, _tmp03));
                    __m256 _r0tm3 = _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.f), _mm256_sub_ps(_tmp01, _tmp03), _mm256_sub_ps(_tmp04, _tmp02));
                    __m256 _r0tm4 = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _mm256_sub_ps(_tmp01, _tmp03), _mm256_sub_ps(_tmp04, _tmp02));
                    __m256 _r0tm5 = _mm256_comp_fmadd_ps(_mm256_set1_ps(-5.f), _tmp03, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp01, _tmp05));

                    _mm256_store_ps(r0_tm_0, _r0tm0);
                    _mm256_store_ps(r0_tm_1, _r0tm1);
                    _mm256_store_ps(r0_tm_2, _r0tm2);
                    _mm256_store_ps(r0_tm_3, _r0tm3);
                    _mm256_store_ps(r0_tm_4, _r0tm4);
                    _mm256_store_ps(r0_tm_5, _r0tm5);

                    r0_tm_0 += tiles * 8 * 6;
                    r0_tm_1 += tiles * 8 * 6;
                    r0_tm_2 += tiles * 8 * 6;
                    r0_tm_3 += tiles * 8 * 6;
                    r0_tm_4 += tiles * 8 * 6;
                    r0_tm_5 += tiles * 8 * 6;
                }
            }
        }
    }
}